

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLValidator.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::XMLValidator::emitError
          (XMLValidator *this,Codes toEmit,Codes originalExceptCode,XMLCh *text1,XMLCh *text2,
          XMLCh *text3,XMLCh *text4)

{
  int *piVar1;
  XMLScanner *pXVar2;
  Codes *pCVar3;
  ulong uVar4;
  Codes CVar5;
  LastExtEntityInfo lastInfo;
  XMLCh errText [2048];
  LastExtEntityInfo local_1048;
  undefined1 local_1028 [4104];
  
  CVar5 = toEmit & ~E_LowBounds;
  if (CVar5 != W_LowBounds) {
    piVar1 = &this->fScanner->fErrorCount;
    *piVar1 = *piVar1 + 1;
  }
  if (this->fErrorReporter != (XMLErrorReporter *)0x0) {
    (**(code **)(*sMsgLoader + 0x18))
              (sMsgLoader,toEmit,local_1028,0x7ff,text1,text2,text3,text4,
               this->fScanner->fMemoryManager);
    ReaderMgr::getLastExtEntityInfo(this->fReaderMgr,&local_1048);
    if (CVar5 == W_LowBounds) {
      uVar4 = 0;
    }
    else if (CVar5 == F_LowBounds) {
      uVar4 = 2;
    }
    else {
      uVar4 = (ulong)((uint)(0x4e < toEmit - E_LowBounds) * 2 + 1);
    }
    (*this->fErrorReporter->_vptr_XMLErrorReporter[2])
              (this->fErrorReporter,(ulong)originalExceptCode,&XMLUni::fgExceptDomain,uVar4,
               local_1028,local_1048.systemId,
               CONCAT44(local_1048.publicId._4_4_,local_1048.publicId._0_4_),
               CONCAT44(local_1048.lineNumber._4_4_,(undefined4)local_1048.lineNumber),
               local_1048.colNumber);
  }
  if (toEmit - E_LowBounds < 0x4f) {
    pXVar2 = this->fScanner;
    if ((CVar5 != F_LowBounds) && (pXVar2->fValidationConstraintFatal == false)) {
      return;
    }
  }
  else {
    if (CVar5 != F_LowBounds) {
      return;
    }
    pXVar2 = this->fScanner;
  }
  if ((pXVar2->fExitOnFirstFatal == true) && (pXVar2->fInException == false)) {
    pCVar3 = (Codes *)__cxa_allocate_exception(4);
    *pCVar3 = toEmit;
    __cxa_throw(pCVar3,&XMLValid::Codes::typeinfo,0);
  }
  return;
}

Assistant:

void XMLValidator::emitError(const  XMLValid::Codes toEmit
                            , const XMLExcepts::Codes   originalExceptCode
                            , const XMLCh* const    text1
                            , const XMLCh* const    text2
                            , const XMLCh* const    text3
                            , const XMLCh* const    text4)
{
    // Bump the error count if it is not a warning
    if (XMLValid::errorType(toEmit) != XMLErrorReporter::ErrType_Warning)
        fScanner->incrementErrorCount();

    //	Call error reporter if we have one
    if (fErrorReporter)
    {
        //
        //  Load the message into alocal and replace any tokens found in
        //  the text.
        //
        const XMLSize_t maxChars = 2047;
        XMLCh errText[maxChars + 1];

        // load the text
        if (!sMsgLoader->loadMsg(toEmit, errText, maxChars, text1, text2, text3, text4, fScanner->getMemoryManager()))
        {
          // <TBD> Should probably load a default message here
        }

        //
        //  Create a LastExtEntityInfo structure and get the reader manager
        //  to fill it in for us. This will give us the information about
        //  the last reader on the stack that was an external entity of some
        //  sort (i.e. it will ignore internal entities.
        //
        ReaderMgr::LastExtEntityInfo lastInfo;
        fReaderMgr->getLastExtEntityInfo(lastInfo);

        fErrorReporter->error
        (
            originalExceptCode
            , XMLUni::fgExceptDomain    //XMLUni::fgValidityDomain
            , XMLValid::errorType(toEmit)
            , errText
            , lastInfo.systemId
            , lastInfo.publicId
            , lastInfo.lineNumber
            , lastInfo.colNumber
        );
    }

    // Bail out if its fatal an we are to give up on the first fatal error
    if (((XMLValid::isError(toEmit) && fScanner->getValidationConstraintFatal())
         || XMLValid::isFatal(toEmit))
    &&  fScanner->getExitOnFirstFatal()
    &&  !fScanner->getInException())
    {
        throw toEmit;
    }
}